

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knucleotide.cc
# Opt level: O0

int main(void)

{
  int iVar1;
  _Setprecision _Var2;
  _Setiosflags _Var3;
  pointer pvVar4;
  size_type sVar5;
  char *pcVar6;
  reference pvVar7;
  iterator pvVar8;
  iterator __last;
  iterator iVar9;
  iterator iVar10;
  iterator iVar11;
  ostream *poVar12;
  bool bVar13;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_158;
  const_iterator local_150;
  char local_141;
  char *local_140;
  char *i;
  undefined1 local_128 [8];
  array<char,_256UL> buf;
  Data data;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(buf._M_elems + 0xf8));
  do {
    pvVar4 = std::array<char,_256UL>::data((array<char,_256UL> *)local_128);
    sVar5 = std::array<char,_256UL>::size((array<char,_256UL> *)local_128);
    pcVar6 = fgets(pvVar4,(int)sVar5,_stdin);
    bVar13 = false;
    if (pcVar6 != (char *)0x0) {
      pvVar4 = std::array<char,_256UL>::data((array<char,_256UL> *)local_128);
      iVar1 = memcmp(">THREE",pvVar4,6);
      bVar13 = iVar1 != 0;
    }
  } while (bVar13);
  while( true ) {
    pvVar4 = std::array<char,_256UL>::data((array<char,_256UL> *)local_128);
    sVar5 = std::array<char,_256UL>::size((array<char,_256UL> *)local_128);
    pcVar6 = fgets(pvVar4,(int)sVar5,_stdin);
    bVar13 = false;
    if (pcVar6 != (char *)0x0) {
      pvVar7 = std::array<char,_256UL>::front((array<char,_256UL> *)local_128);
      bVar13 = *pvVar7 != '>';
    }
    if (!bVar13) break;
    pvVar7 = std::array<char,_256UL>::front((array<char,_256UL> *)local_128);
    if (*pvVar7 != ';') {
      pvVar8 = std::array<char,_256UL>::begin((array<char,_256UL> *)local_128);
      __last = std::array<char,_256UL>::end((array<char,_256UL> *)local_128);
      local_141 = '\n';
      local_140 = std::find<char*,char>(pvVar8,__last,&local_141);
      local_158._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               (buf._M_elems + 0xf8));
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  *)&local_150,&local_158);
      pvVar8 = std::array<char,_256UL>::begin((array<char,_256UL> *)local_128);
      std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<char*,void>
                ((vector<unsigned_char,std::allocator<unsigned_char>> *)(buf._M_elems + 0xf8),
                 local_150,pvVar8,local_140);
    }
  }
  pcVar6 = buf._M_elems + 0xf8;
  iVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pcVar6);
  iVar10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pcVar6);
  iVar11 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)pcVar6);
  std::
  transform<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,main::__0>
            (iVar9._M_current,iVar10._M_current,iVar11._M_current);
  _Var2 = std::setprecision(3);
  poVar12 = std::operator<<((ostream *)&std::cout,_Var2);
  _Var3 = std::setiosflags(_S_fixed);
  std::operator<<(poVar12,_Var3);
  WriteFrequencies<1u>((Data *)(buf._M_elems + 0xf8));
  WriteFrequencies<2u>((Data *)(buf._M_elems + 0xf8));
  WriteCount<3u>((Data *)(buf._M_elems + 0xf8),"GGT");
  WriteCount<4u>((Data *)(buf._M_elems + 0xf8),"GGTA");
  WriteCount<6u>((Data *)(buf._M_elems + 0xf8),"GGTATT");
  WriteCount<12u>((Data *)(buf._M_elems + 0xf8),"GGTATTTTAATT");
  WriteCount<18u>((Data *)(buf._M_elems + 0xf8),"GGTATTTTAATTTATAGT");
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(buf._M_elems + 0xf8));
  return 0;
}

Assistant:

int main()
{
    Cfg::Data data;
    std::array<char, 256> buf;

    while(fgets(buf.data(), static_cast<int>(buf.size()), stdin) && memcmp(">THREE", buf.data(), 6));
    while(fgets(buf.data(), static_cast<int>(buf.size()), stdin) && buf.front() != '>') {
        if(buf.front() != ';'){
            auto i = std::find(buf.begin(), buf.end(), '\n');
            data.insert(data.end(), buf.begin(), i);
        }
    }
    std::transform(data.begin(), data.end(), data.begin(), [](unsigned char c){
        return cfg.to_num[c];
    });
    std::cout << std::setprecision(3) << std::setiosflags(std::ios::fixed);

    WriteFrequencies<1>(data);
    WriteFrequencies<2>(data);
    // value at left is the length of the passed string.
    WriteCount<3>(data, "GGT");
    WriteCount<4>(data, "GGTA");
    WriteCount<6>(data, "GGTATT");
    WriteCount<12>(data, "GGTATTTTAATT");
    WriteCount<18>(data, "GGTATTTTAATTTATAGT");
}